

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O2

bool __thiscall Assimp::DefaultIOSystem::ComparePaths(DefaultIOSystem *this,char *one,char *second)

{
  int iVar1;
  bool bVar2;
  string temp1;
  string temp2;
  string sStack_58;
  string local_38;
  
  iVar1 = strcasecmp(one,second);
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else {
    MakeAbsolutePath_abi_cxx11_(&sStack_58,one);
    MakeAbsolutePath_abi_cxx11_(&local_38,second);
    iVar1 = ASSIMP_stricmp(&sStack_58,&local_38);
    bVar2 = iVar1 == 0;
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  return bVar2;
}

Assistant:

bool DefaultIOSystem::ComparePaths(const char* one, const char* second) const
{
    // chances are quite good both paths are formatted identically,
    // so we can hopefully return here already
    if (!ASSIMP_stricmp(one, second))
        return true;

    std::string temp1 = MakeAbsolutePath(one);
    std::string temp2 = MakeAbsolutePath(second);

    return !ASSIMP_stricmp(temp1, temp2);
}